

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O0

int handle_erratum_skd022(pt_insn_decoder *decoder)

{
  uint64_t uVar1;
  int errcode;
  uint64_t ip;
  pt_event *ev;
  pt_insn_decoder *decoder_local;
  
  if (decoder == (pt_insn_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    decoder_local._4_4_ = check_erratum_skd022(decoder);
    if (0 < decoder_local._4_4_) {
      uVar1 = (decoder->event).variant.async_disabled.ip;
      (decoder->event).type = ptev_disabled;
      (decoder->event).variant.enabled.ip = uVar1;
      decoder_local._4_4_ = 1;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

static inline int handle_erratum_skd022(struct pt_insn_decoder *decoder)
{
	struct pt_event *ev;
	uint64_t ip;
	int errcode;

	if (!decoder)
		return -pte_internal;

	errcode = check_erratum_skd022(decoder);
	if (errcode <= 0)
		return errcode;

	/* We turn the async disable into a sync disable.  It will be processed
	 * after decoding the instruction.
	 */
	ev = &decoder->event;

	ip = ev->variant.async_disabled.ip;

	ev->type = ptev_disabled;
	ev->variant.disabled.ip = ip;

	return 1;
}